

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

bson_t * get_bson(char *filename)

{
  int __fd;
  ulong uVar1;
  bson_t *pbVar2;
  int fd;
  ssize_t len;
  bson_t *b;
  uint8_t buf [4096];
  char *filename_local;
  
  __fd = open(filename,0);
  if (__fd == -1) {
    fprintf(_stderr,"Failed to open: %s\n",filename);
    abort();
  }
  uVar1 = read(__fd,&b,0x1000);
  if ((long)uVar1 < 0) {
    fprintf(_stderr,"Failed to read: %s\n",filename);
    abort();
  }
  if ((long)uVar1 < 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x30,"get_bson","len > 0");
    abort();
  }
  pbVar2 = (bson_t *)bson_new_from_data(&b,uVar1 & 0xffffffff);
  close(__fd);
  return pbVar2;
}

Assistant:

static bson_t *
get_bson (const char *filename)
{
   uint8_t buf[4096];
   bson_t *b;
   ssize_t len;
   int fd;

   if (-1 == (fd = bson_open (filename, O_RDONLY))) {
      fprintf (stderr, "Failed to open: %s\n", filename);
      abort ();
   }
   if ((len = bson_read (fd, buf, sizeof buf)) < 0) {
      fprintf (stderr, "Failed to read: %s\n", filename);
      abort ();
   }
   BSON_ASSERT (len > 0);
   b = bson_new_from_data (buf, (uint32_t) len);
   bson_close (fd);

   return b;
}